

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::CompactReporter::AssertionPrinter::printSourceInfo(AssertionPrinter *this)

{
  ostream *os;
  Colour colourGuard;
  char local_21;
  SourceLineInfo local_20;
  
  Colour::use(FileName);
  os = this->stream;
  local_20.file = (this->result->m_info).lineInfo.file;
  local_20.line = (this->result->m_info).lineInfo.line;
  operator<<(os,&local_20);
  local_21 = ':';
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_21,1);
  Colour::use(None);
  return;
}

Assistant:

void printSourceInfo() const {
                Colour colourGuard( Colour::FileName );
                stream << result.getSourceInfo() << ':';
            }